

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_lookup.cpp
# Opt level: O0

SN_ELEMENT * __thiscall ON_SN_BLOCK::BinarySearchBlockHelper(ON_SN_BLOCK *this,ON__UINT64 sn)

{
  ulong uVar1;
  ulong uVar2;
  ON__UINT64 midsn;
  SN_ELEMENT *e;
  ON__UINT64 j;
  ON__UINT64 i;
  ON__UINT64 sn_local;
  ON_SN_BLOCK *this_local;
  
  midsn = (ON__UINT64)this->m_sn;
  uVar2 = (ulong)this->m_count;
  while( true ) {
    do {
      j = uVar2;
      if (j == 0) {
        return (SN_ELEMENT *)0x0;
      }
      uVar2 = j >> 1;
      uVar1 = *(ulong *)(midsn + uVar2 * 0x38 + 0x10);
    } while (sn < uVar1);
    if (sn <= uVar1) break;
    midsn = (uVar2 + 1) * 0x38 + midsn;
    uVar2 = j - (uVar2 + 1);
  }
  return (SN_ELEMENT *)(midsn + uVar2 * 0x38);
}

Assistant:

struct ON_SerialNumberMap::SN_ELEMENT* ON_SN_BLOCK::BinarySearchBlockHelper(ON__UINT64 sn)
{
  // Perform a binary search on the serial number values in the m_sn[] array.
  //
  // This is a high speed helper function.  
  //
  // The calling function verify:
  //   m_sn[] is sorted by serial number (1 == m_sorted)
  //   m_count > 0
  //   m_sn0 <= sn <= m_sn1.

  ON__UINT64 i, j;
  struct ON_SerialNumberMap::SN_ELEMENT* e;
  ON__UINT64 midsn;

  i = m_count;
  e = m_sn;
  while (i > 0 )
  {
    midsn = e[(j=i/2)].m_sn;
    if ( sn < midsn )
    {
      i = j;
    }
    else if ( sn > midsn )
    {
      j++;
      e += j;
      i -= j;
    }
    else 
    {
      return e + j;
    }
  }
  return 0;
}